

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O2

void set_want_move(Am_Object *inter,bool want_move)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Object main_win;
  Am_Value value;
  Am_Object owner;
  Am_Object local_60;
  Am_Object win;
  Am_Object obj;
  Am_Value_List new_list;
  Am_Object local_38;
  
  owner.data = (Am_Object_Data *)0x0;
  main_win.data = (Am_Object_Data *)0x0;
  Am_Object::Get_Owner((Am_Object *)&value,(Am_Slot_Flags)inter);
  Am_Object::operator=(&owner,(Am_Object *)&value);
  Am_Object::~Am_Object((Am_Object *)&value);
  bVar1 = Am_Object::Valid(&owner);
  if (!bVar1) goto LAB_001ba8c0;
  pAVar3 = Am_Object::Get(&owner,0x68,0);
  Am_Object::operator=(&main_win,pAVar3);
  bVar1 = Am_Object::Valid(&main_win);
  if (bVar1) {
    Am_Object::Am_Object(&local_60,&main_win);
    set_want_move_one_win(&local_60,want_move);
    Am_Object::~Am_Object(&local_60);
  }
  value.type = 0;
  value.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar3 = Am_Object::Get(inter,0x118,1);
  Am_Value::operator=(&value,pAVar3);
  bVar1 = Am_Value::Valid(&value);
  if (!bVar1) {
    pAVar3 = Am_Object::Get(inter,0x116,1);
    Am_Value::operator=(&value,pAVar3);
  }
  if (value.type == 0xa002) {
    Am_Value_List::Am_Value_List(&new_list);
    Am_Value_List::operator=(&new_list,&value);
    bVar1 = Am_Object::Valid(&main_win);
    if (bVar1) {
      obj.data = (Am_Object_Data *)0x0;
      win.data = (Am_Object_Data *)0x0;
      Am_Value_List::Start(&new_list);
      while (bVar1 = Am_Value_List::Last(&new_list), !bVar1) {
        pAVar3 = Am_Value_List::Get(&new_list);
        Am_Object::operator=(&obj,pAVar3);
        pAVar3 = Am_Object::Get(&obj,0x68,0);
        Am_Object::operator=(&win,pAVar3);
        bVar1 = Am_Object::operator!=(&win,&main_win);
        if (bVar1) {
          Am_Object::Am_Object(&local_38,&win);
          set_want_move_one_win(&local_38,want_move);
          Am_Object::~Am_Object(&local_38);
        }
        Am_Value_List::Next(&new_list);
      }
      Am_Object::~Am_Object(&win);
      Am_Object::~Am_Object(&obj);
    }
    Am_Value_List::~Am_Value_List(&new_list);
  }
  else if (value.type == 4) {
    bVar1 = Am_Value::operator_cast_to_bool(&value);
    if (bVar1) goto LAB_001ba7bc;
  }
  else if ((value.type == 2) && (iVar2 = Am_Value::operator_cast_to_int(&value), iVar2 != 0)) {
LAB_001ba7bc:
    set_want_move_all_wins(&Am_Window,want_move);
  }
  Am_Value::~Am_Value(&value);
LAB_001ba8c0:
  Am_Object::~Am_Object(&main_win);
  Am_Object::~Am_Object(&owner);
  return;
}

Assistant:

static void
set_want_move(const Am_Object &inter, bool want_move)
{
  //first do the main window
  Am_Object owner, main_win;
  owner = inter.Get_Owner();
  if (owner.Valid()) {
    main_win = owner.Get(Am_WINDOW);
    if (main_win.Valid())
      set_want_move_one_win(main_win, want_move);

    // next, do any other windows
    Am_Value value;
    value = inter.Peek(Am_ALL_WINDOWS);
    if (!value.Valid())
      value = inter.Peek(Am_MULTI_OWNERS);
    switch (value.type) {
    case Am_INT:
      if ((int)value != 0)
        //Am_window is root of instance tree
        set_want_move_all_wins(Am_Window, want_move);
      break;
    case Am_BOOL:
      if ((bool)value != false)
        set_want_move_all_wins(Am_Window, want_move);
      break;
    case Am_VALUE_LIST: { //a list of objects
      Am_Value_List new_list;
      new_list = value;
      if (main_win.Valid())
        set_want_move_for_objs_wins(new_list, main_win, want_move);
      break;
    }
    } // end switch on new value
  }
}